

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          CappedArray<char,_14UL> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,ArrayPtr<const_char> *params_6,
          FixedArray<char,_1UL> *params_7)

{
  size_t size;
  char *target;
  initializer_list<unsigned_long> nums;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  undefined8 local_38;
  
  local_70 = *(undefined8 *)(this + 8);
  local_68 = params->ptr;
  local_60 = *(undefined8 *)params_1->content;
  local_58 = params_2->size_;
  local_50 = params_3->size_;
  local_48 = params_4->size_;
  local_40 = params_5->size_;
  local_38 = 1;
  nums._M_len = (size_type)params_5;
  nums._M_array = (iterator)0x8;
  size = sum((_ *)&local_70,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (target,(ArrayPtr<const_char> *)this,(CappedArray<char,_14UL> *)params,
             (ArrayPtr<const_char> *)params_1,params_2,params_3,params_4,params_5,
             (FixedArray<char,_1UL> *)params_6);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}